

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall CScriptCheck::operator()(CScriptCheck *this)

{
  pointer pCVar1;
  bool bVar2;
  long in_FS_OFFSET;
  BaseSignatureChecker local_50;
  CTransaction *local_48;
  undefined4 local_40;
  uint local_3c;
  CAmount local_38;
  PrecomputedTransactionData *local_30;
  undefined1 local_28;
  SignatureCache *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = this->ptxTo;
  local_3c = this->nIn;
  pCVar1 = (local_48->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_28 = this->cacheStore;
  local_20 = this->m_signature_cache;
  local_30 = this->txdata;
  local_40 = 0;
  local_38 = (this->m_tx_out).nValue;
  local_50._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_00a24f28;
  bVar2 = VerifyScript(&pCVar1[local_3c].scriptSig,&(this->m_tx_out).scriptPubKey,
                       &pCVar1[local_3c].scriptWitness,this->nFlags,&local_50,&this->error);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CScriptCheck::operator()() {
    const CScript &scriptSig = ptxTo->vin[nIn].scriptSig;
    const CScriptWitness *witness = &ptxTo->vin[nIn].scriptWitness;
    return VerifyScript(scriptSig, m_tx_out.scriptPubKey, witness, nFlags, CachingTransactionSignatureChecker(ptxTo, nIn, m_tx_out.nValue, cacheStore, *m_signature_cache, *txdata), &error);
}